

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O2

Result<wasm::WATParser::Ok> *
wasm::WATParser::anon_unknown_11::fieldidx<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
          (_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::Err> *__return_storage_ptr__,
          ParseInput *ctx)

{
  optional<unsigned_int> oVar1;
  string local_68;
  undefined1 local_48 [8];
  optional<wasm::Name> id;
  allocator<char> local_21;
  
  oVar1 = ParseInput::takeU32(ctx);
  if ((((ulong)oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) &&
     (ParseInput::takeID((optional<wasm::Name> *)local_48,ctx),
     id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
     super__Optional_payload_base<wasm::Name>._M_payload._8_1_ != '\x01')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"expected field index or identifier",&local_21);
    ParseInput::err((Err *)local_48,ctx,&local_68);
    std::__detail::__variant::_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::Err>::
    _Variant_storage<1ul,wasm::WATParser::Err>(__return_storage_ptr__,local_48);
    std::__cxx11::string::~string((string *)local_48);
    std::__cxx11::string::~string((string *)&local_68);
    return (Result<wasm::WATParser::Ok> *)__return_storage_ptr__;
  }
  __return_storage_ptr__[0x20] =
       (_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::Err>)0x0;
  return (Result<wasm::WATParser::Ok> *)__return_storage_ptr__;
}

Assistant:

Result<typename Ctx::FieldIdxT> fieldidx(Ctx& ctx,
                                         typename Ctx::HeapTypeT type) {
  if (auto x = ctx.in.takeU32()) {
    return ctx.getFieldFromIdx(type, *x);
  }
  if (auto id = ctx.in.takeID()) {
    return ctx.getFieldFromName(type, *id);
  }
  return ctx.in.err("expected field index or identifier");
}